

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O0

int onig_st_lookup(st_table *table,st_data_t key,st_data_t *value)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  st_table_entry *local_38;
  st_table_entry *ptr;
  uint bin_pos;
  uint hash_val;
  st_data_t *value_local;
  st_data_t key_local;
  st_table *table_local;
  
  uVar1 = (*table->type->hash)(key);
  local_38 = table->bins[uVar1 % (uint)table->num_bins];
  if ((local_38 != (st_table_entry *)0x0) &&
     ((local_38->hash != uVar1 ||
      ((key != local_38->key && (iVar2 = (*table->type->compare)(key,local_38->key), iVar2 != 0)))))
     ) {
    while( true ) {
      bVar3 = false;
      if ((local_38->next != (st_table_entry *)0x0) && (bVar3 = true, local_38->next->hash == uVar1)
         ) {
        bVar3 = true;
        if (key != local_38->next->key) {
          iVar2 = (*table->type->compare)(key,local_38->next->key);
          bVar3 = iVar2 == 0;
        }
        bVar3 = (bool)(bVar3 ^ 1);
      }
      if (!bVar3) break;
      local_38 = local_38->next;
    }
    local_38 = local_38->next;
  }
  if (local_38 == (st_table_entry *)0x0) {
    table_local._4_4_ = 0;
  }
  else {
    if (value != (st_data_t *)0x0) {
      *value = local_38->record;
    }
    table_local._4_4_ = 1;
  }
  return table_local._4_4_;
}

Assistant:

extern int
st_lookup(st_table* table, register st_data_t key, st_data_t* value)
{
  unsigned int hash_val, bin_pos;
  register st_table_entry *ptr;

  hash_val = do_hash(key, table);
  FIND_ENTRY(table, ptr, hash_val, bin_pos);

  if (ptr == 0) {
    return 0;
  }
  else {
    if (value != 0)  *value = ptr->record;
    return 1;
  }
}